

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O2

bool ConvertToInt(char *str,int defaultrad,size_t len,int *Result)

{
  char cVar1;
  byte Hex;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  
  if (len == 0) {
    len = strlen(str);
  }
  cVar1 = *str;
  if (cVar1 == '$') {
    str = str + 1;
LAB_0013e7fc:
    len = len - 1;
LAB_0013e7ff:
    uVar4 = 0xe;
LAB_0013e83f:
    uVar4 = uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f;
    bVar2 = false;
    switch(uVar4) {
    case 0:
      for (sVar5 = 0; len != sVar5; sVar5 = sVar5 + 1) {
        if ((str[sVar5] & 0xfeU) != 0x30) goto LAB_0013e92b;
        uVar4 = (uint)(str[sVar5] == 0x31) + uVar4 * 2;
      }
      break;
    default:
      goto switchD_0013e85c_caseD_1;
    case 3:
      uVar4 = 0;
      for (sVar5 = 0; len != sVar5; sVar5 = sVar5 + 1) {
        if ((byte)(str[sVar5] - 0x38U) < 0xf8) goto LAB_0013e92b;
        uVar4 = (uint)(byte)(str[sVar5] - 0x30) + uVar4 * 8;
      }
      break;
    case 4:
      uVar4 = 0;
      for (sVar5 = 0; len != sVar5; sVar5 = sVar5 + 1) {
        if ((byte)(str[sVar5] - 0x3aU) < 0xf6) goto LAB_0013e92b;
        uVar4 = (uint)(byte)(str[sVar5] - 0x30) + uVar4 * 10;
      }
      break;
    case 7:
      sVar5 = 0;
      uVar4 = 0;
      do {
        if (len == sVar5) goto LAB_0013e92f;
        Hex = str[sVar5];
        if ((byte)(Hex - 0x3a) < 0xf6) {
          if (0x25 < Hex - 0x41) {
            return false;
          }
          if ((0x3f0000003fU >> ((ulong)(Hex - 0x41) & 0x3f) & 1) == 0) {
            return false;
          }
        }
        iVar3 = htd(Hex);
        uVar4 = uVar4 * 0x10 + iVar3;
        sVar5 = sVar5 + 1;
      } while (-1 < iVar3);
      goto LAB_0013e92b;
    }
LAB_0013e92f:
    *Result = uVar4;
    bVar2 = true;
  }
  else {
    if (cVar1 == '0') {
      cVar1 = str[1];
      if (cVar1 != 'x') {
        if (cVar1 == 'o') {
          str = str + 2;
          len = len - 2;
          goto LAB_0013e83b;
        }
        if (cVar1 != 'X') goto LAB_0013e80d;
      }
      str = str + 2;
      len = len - 2;
      goto LAB_0013e7ff;
    }
    if ((byte)(cVar1 - 0x30U) < 10) {
LAB_0013e80d:
      cVar1 = str[len - 1];
      if (cVar1 == 'o') {
        len = len - 1;
LAB_0013e83b:
        uVar4 = 6;
      }
      else {
        if (cVar1 == 'h') goto LAB_0013e7fc;
        if (cVar1 == 'b') {
          len = len - 1;
          uVar4 = 0;
        }
        else {
          uVar4 = defaultrad - 2;
        }
      }
      goto LAB_0013e83f;
    }
LAB_0013e92b:
    bVar2 = false;
  }
switchD_0013e85c_caseD_1:
  return bVar2;
}

Assistant:

bool ConvertToInt(char* str, int defaultrad, size_t len, int& Result)
{
	int val = 0;
	int r = 0;
	if (len == 0) len = strlen(str);

	if (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))
	{
		r = 16;
		str+=2;
		len-=2;
	} else if (str[0] == '$')
	{
		r = 16;
		str++;
		len--;
	} else if (str[0] == '0' && str[1] == 'o')
	{
		r = 8;
		str+=2;
		len-=2;
	} else {
		if (!(str[0] >= '0' && str[0] <= '9')) return false;

		if (str[len-1] == 'b')
		{
			r = 2;
			len--;
		} else if (str[len-1] == 'o')
		{
			r = 8;
			len--;
		} else if (str[len-1] == 'h')
		{
			r = 16;
			len--;
		} else {
			r = defaultrad;
		}
	}

	switch (r)
	{
	case 2: // bin
		while (len--)
		{
			if (*str != '0' && *str != '1') return false;
			val = val << 1;
			if (*str++ == '1')
			{
				val++;
			}
		}
		break;
	case 8: // oct
		while (len--)
		{
			if (*str < '0' || *str > '7') return false;
			val = val << 3;
			val+=(*str++-'0');
		}
		break;
	case 10: // dec
		while (len--)
		{
			if (*str < '0' || *str > '9') return false;
			val = val * 10;
			val += (*str++ - '0');
		}
		break;
	case 16: // hex
		while (len--)
		{
			if ((*str < '0' || *str > '9') && (*str < 'A' || *str > 'F') && (*str < 'a' || *str > 'f')) return false;
			int l = htd(*str++);
			if (l >= 0)
			{
				val = val << 4;
				val += l;
			} else {
				return false;
			}
		}
		break;
	default:
		return false;
	}
	Result = val;
	return true;
}